

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node::vq_node(vq_node *this)

{
  vq_node *this_local;
  
  vec<2U,_float>::vec(&this->m_centroid,cClear);
  this->m_total_weight = 0;
  this->m_left = -1;
  this->m_right = -1;
  this->m_codebook_index = -1;
  this->m_unsplittable = false;
  this->m_alternative = false;
  this->m_processed = false;
  return;
}

Assistant:

vq_node() :
                m_centroid(cClear),
                m_total_weight(0),
                m_left(-1),
                m_right(-1),
                m_codebook_index(-1),
                m_unsplittable(false),
                m_alternative(false),
                m_processed(false)
            {
            }